

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_vertex_attribfv(NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLfloat local_14;
  GLint maxVertexAttribs;
  GLfloat params;
  NegativeTestContext *ctx_local;
  
  local_14 = 0.0;
  _maxVertexAttribs = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             &local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetVertexAttribfv
            (&_maxVertexAttribs->super_CallLogWrapper,0,0xffffffff,&local_14);
  NegativeTestContext::expectError(_maxVertexAttribs,0x500);
  NegativeTestContext::endSection(_maxVertexAttribs);
  this = _maxVertexAttribs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_71);
  NegativeTestContext::beginSection(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glGetIntegerv
            (&_maxVertexAttribs->super_CallLogWrapper,0x8869,(GLint *)&local_18);
  glu::CallLogWrapper::glGetVertexAttribfv
            (&_maxVertexAttribs->super_CallLogWrapper,local_18,0x8622,&local_14);
  NegativeTestContext::expectError(_maxVertexAttribs,0x501);
  NegativeTestContext::endSection(_maxVertexAttribs);
  return;
}

Assistant:

void get_vertex_attribfv (NegativeTestContext& ctx)
{
	GLfloat	params				= 0.0f;
	GLint	maxVertexAttribs;

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetVertexAttribfv(0, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxVertexAttribs);
	ctx.glGetVertexAttribfv(maxVertexAttribs, GL_VERTEX_ATTRIB_ARRAY_ENABLED, &params);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}